

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O2

bool __thiscall
StreamReplacer::maybeReplace
          (StreamReplacer *this,QPDFObjGen og,QPDFObjectHandle *stream,Pipeline *pipeline,
          QPDFObjectHandle *dict_updates)

{
  char cVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  mapped_type *pmVar5;
  byte *pbVar6;
  void *__buf;
  size_t __n;
  bool bVar7;
  allocator<char> local_b9;
  shared_ptr<Buffer> out;
  QPDFObjGen og_local;
  uint local_98 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  QPDFObjectHandle mark;
  Pl_XOR p;
  QPDFObjectHandle dict;
  unsigned_long local_30;
  
  og_local = og;
  QPDFObjectHandle::getDict();
  std::__cxx11::string::string<std::allocator<char>>((string *)&p,"/DoXOR",(allocator<char> *)&out);
  QPDFObjectHandle::getKey((string *)&mark);
  std::__cxx11::string::~string((string *)&p);
  cVar1 = QPDFObjectHandle::isBool();
  if (cVar1 != '\0') {
    cVar1 = QPDFObjectHandle::getBoolValue();
    if (cVar1 != '\0') {
      out.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      out.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&p);
      std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&out.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)&p);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p.super_Pipeline.identifier);
      if (dict_updates != (QPDFObjectHandle *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&p,"/OrigLength",&local_b9);
        local_30 = Buffer::getSize();
        QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(&local_30);
        QPDFObjectHandle::newInteger((longlong)local_98);
        QPDFObjectHandle::replaceKey((string *)dict_updates,(QPDFObjectHandle *)&p);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
        std::__cxx11::string::~string((string *)&p);
        iVar4 = og_local.obj;
        p.super_Pipeline._vptr_Pipeline = (_func_int **)Buffer::getSize();
        iVar3 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert((unsigned_long *)&p);
        local_98[0] = iVar3 * iVar4 & 0xff;
        uVar2 = QIntC::IntConverter<int,_unsigned_char,_true,_false>::convert((int *)local_98);
        pmVar5 = std::
                 map<QPDFObjGen,_unsigned_char,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_unsigned_char>_>_>
                 ::operator[](&this->keys,&og_local);
        *pmVar5 = uVar2;
      }
      bVar7 = true;
      if (pipeline != (Pipeline *)0x0) {
        pbVar6 = std::
                 map<QPDFObjGen,_unsigned_char,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_unsigned_char>_>_>
                 ::operator[](&this->keys,&og_local);
        __n = (size_t)*pbVar6;
        Pl_XOR::Pl_XOR(&p,"xor",pipeline,*pbVar6);
        iVar4 = Buffer::getBuffer();
        __buf = (void *)Buffer::getSize();
        Pl_XOR::write(&p,iVar4,__buf,__n);
        Pl_XOR::finish(&p);
        Pipeline::~Pipeline(&p.super_Pipeline);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&out.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      goto LAB_00104a75;
    }
  }
  bVar7 = false;
LAB_00104a75:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mark.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar7;
}

Assistant:

bool
StreamReplacer::maybeReplace(
    QPDFObjGen og, QPDFObjectHandle& stream, Pipeline* pipeline, QPDFObjectHandle* dict_updates)
{
    // As described in the class comments, this method is called twice. Before writing has started
    // pipeline is nullptr, and dict_updates is provided. In this mode, we figure out whether we
    // should replace the stream and, if so, take care of the necessary setup. When we are actually
    // ready to supply the data, this method is called again with pipeline populated and
    // dict_updates as a nullptr. In this mode, we are not allowed to change anything, since writing
    // is already in progress. We must simply provide the stream data.

    // The return value indicates whether or not we should replace the stream. If the first call
    // returns false, there will be no second call. If the second call returns false, something went
    // wrong since the method should always make the same decision for a given stream.

    // For this example, all the determination logic could have appeared inside the if
    // (dict_updates) block rather than being duplicated, but in some cases, there may be a reason
    // to duplicate things. For example, if you wanted to write code that re-encoded an image if the
    // new encoding was more efficient, you'd have to actually try it out. Then you would either
    // have to cache the result somewhere or just repeat the calculations, depending on space/time
    // constraints, etc.

    // In our contrived example, we are replacing the data for all streams that have /DoXOR = true
    // in the stream dictionary. If this were a more realistic application, our criteria would be
    // more sensible. For example, an image downsampler might choose to replace a stream that
    // represented an image with a high pixel density.
    auto dict = stream.getDict();
    auto mark = dict.getKey("/DoXOR");
    if (!(mark.isBool() && mark.getBoolValue())) {
        return false;
    }

    // We can't replace the stream data if we can't get the original stream data for any reason. A
    // more realistic application may actually look at the data here as well, or it may be able to
    // make all its decisions from the stream dictionary. However, it's a good idea to make sure we
    // can retrieve the filtered data if we are going to need it later.
    std::shared_ptr<Buffer> out;
    try {
        out = stream.getStreamData();
    } catch (...) {
        return false;
    }

    if (dict_updates) {
        // It's not safe to make any modifications to any objects during the writing process since
        // the updated objects may have already been written. In this mode, when dict_updates is
        // provided, we have not started writing. Store the modifications we intend to make to the
        // stream dictionary here. We're just storing /OrigLength for purposes of example. Again, a
        // realistic application would make other changes. For example, an image resampler might
        // change the dimensions or other properties of the image.
        dict_updates->replaceKey(
            "/OrigLength", QPDFObjectHandle::newInteger(QIntC::to_longlong(out->getSize())));
        // We are also storing the "key" that we will access when writing the data.
        this->keys[og] = QIntC::to_uchar((og.getObj() * QIntC::to_int(out->getSize())) & 0xff);
    }

    if (pipeline) {
        unsigned char key = this->keys[og];
        Pl_XOR p("xor", pipeline, key);
        p.write(out->getBuffer(), out->getSize());
        p.finish();
    }
    return true;
}